

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_uninitialized_relocate_n<QPropertyBindingPrivatePtr,long_long>
               (QPropertyBindingPrivatePtr *first,longlong n,QPropertyBindingPrivatePtr *out)

{
  undefined8 uVar1;
  long lVar2;
  
  if (n != 0) {
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&first->d + lVar2);
      *(undefined8 *)((long)&first->d + lVar2) = 0;
      *(undefined8 *)((long)&out->d + lVar2) = uVar1;
      lVar2 = lVar2 + 8;
    } while (n * 8 - lVar2 != 0);
  }
  if (0 < n) {
    lVar2 = n + 1;
    do {
      QPropertyBindingPrivatePtr::~QPropertyBindingPrivatePtr(first);
      first = first + 1;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

void q_uninitialized_relocate_n(T* first, N n, T* out)
{
    if constexpr (QTypeInfo<T>::isRelocatable) {
        static_assert(std::is_copy_constructible_v<T> || std::is_move_constructible_v<T>,
                      "Refusing to relocate this non-copy/non-move-constructible type.");
        if (n != N(0)) { // even if N == 0, out == nullptr or first == nullptr are UB for memcpy()
            std::memcpy(static_cast<void *>(out),
                        static_cast<const void *>(first),
                        n * sizeof(T));
        }
    } else {
        q_uninitialized_move_if_noexcept_n(first, n, out);
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(first, n);
    }
}